

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINSimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
LINSimulationDataGenerator::GenerateSimulationData
          (LINSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar1 <= uVar2) break;
    CreateFrame(this);
  }
  *simulation_channel = &this->mSerialSimulationData;
  return 1;
}

Assistant:

U32 LINSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                        SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mSerialSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateFrame();
        // CreateFrame();
        // CreateBadFrame();
    }

    *simulation_channel = &mSerialSimulationData;
    return 1;
}